

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ProductionSyntax::setChild(ProductionSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00c9279c + *(int *)(&DAT_00c9279c + in_RSI * 4)))();
  return;
}

Assistant:

void ProductionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: dataType = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 1: name = child.token(); return;
        case 2: portList = child.node() ? &child.node()->as<FunctionPortListSyntax>() : nullptr; return;
        case 3: colon = child.token(); return;
        case 4: rules = child.node()->as<SeparatedSyntaxList<RsRuleSyntax>>(); return;
        case 5: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}